

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int VmJsonArrayDecoder(jx9_context *pCtx,jx9_value *pKey,jx9_value *pWorker,void *pUserData)

{
  jx9_value *pArray;
  void *pUserData_local;
  jx9_value *pWorker_local;
  jx9_value *pKey_local;
  jx9_context *pCtx_local;
  
  jx9_array_add_elem((jx9_value *)pUserData,pKey,pWorker);
  return 0;
}

Assistant:

static int VmJsonArrayDecoder(jx9_context *pCtx, jx9_value *pKey, jx9_value *pWorker, void *pUserData)
{
	jx9_value *pArray = (jx9_value *)pUserData;
	/* Insert the entry */
	jx9_array_add_elem(pArray, pKey, pWorker); /* Will make it's own copy */
	SXUNUSED(pCtx); /* cc warning */
	/* All done */
	return SXRET_OK;
}